

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx512::create_pipeline(Deconvolution_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  _func_int *p_Var7;
  ulong uVar8;
  int _w;
  ulong uVar9;
  undefined4 *puVar10;
  int k;
  int _h;
  ulong uVar11;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  Mat local_c0;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  undefined1 auStack_48 [12];
  size_t local_38;
  
  p_Var7 = this->_vptr_Deconvolution_x86_avx512[-3];
  uVar9 = (long)*(int *)(&this->field_0xd8 + (long)p_Var7) *
          (long)*(int *)(&this->field_0xd4 + (long)p_Var7);
  _w = (int)uVar9;
  uVar17 = (long)*(int *)(&this->field_0x110 + (long)p_Var7) / (long)_w;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
           (long)*(int *)(&this->field_0xd0 + (long)p_Var7);
  local_38 = 0;
  local_78._0_8_ = (Allocator *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  iVar19 = 0;
  local_58 = (Allocator *)local_78._0_8_;
  iStack_50 = local_78._8_4_;
  iStack_4c = local_78._12_4_;
  auStack_48 = local_78._16_12_;
  Mat::create((Mat *)local_78,*(int *)(&this->field_0x18c + (long)p_Var7),4,(Allocator *)0x0);
  pp_Var2 = this->_vptr_Deconvolution_x86_avx512;
  p_Var7 = pp_Var2[-3];
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var7);
  _h = (int)uVar17;
  if (0 < (int)(uVar1 * _h)) {
    lVar12 = *(long *)(&this->field_0x160 + (long)p_Var7);
    puVar13 = (undefined4 *)(local_78._0_8_ + uVar9 * 4 + -4);
    do {
      if (0 < _w) {
        uVar8 = 0;
        puVar18 = puVar13;
        do {
          *puVar18 = *(undefined4 *)(lVar12 + uVar8 * 4);
          uVar8 = uVar8 + 1;
          puVar18 = puVar18 + -1;
        } while ((uVar9 & 0xffffffff) != uVar8);
        p_Var7 = pp_Var2[-3];
      }
      iVar19 = iVar19 + 1;
      uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var7);
      lVar12 = lVar12 + uVar9 * 4;
      puVar13 = puVar13 + uVar9;
    } while (iVar19 < (int)(uVar1 * _h));
  }
  uVar21 = 1;
  uVar8 = 1;
  if (opt->use_packing_layout != false) {
    uVar8 = 0x10;
    uVar21 = 0x10;
    if ((uVar17 & 0xf) != 0) {
      if ((uVar17 & 7) == 0) {
        uVar21 = 8;
      }
      else {
        uVar21 = (ulong)((uint)((uVar17 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 7) == 0) {
        uVar8 = 8;
      }
      else {
        uVar8 = (ulong)((uint)((uVar1 & 3) == 0) * 3 + 1);
      }
    }
  }
  Mat::reshape(&local_c0,(Mat *)local_78,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var7),
               (Allocator *)0x0);
  iVar20 = (int)uVar21;
  iVar19 = (int)uVar8;
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar20),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) / iVar19,
              (ulong)(uint)(iVar19 * iVar20 * 4),iVar19 * iVar20,(Allocator *)0x0);
  pp_Var2 = this->_vptr_Deconvolution_x86_avx512;
  p_Var7 = pp_Var2[-3];
  if (iVar19 <= *(int *)(&this->field_0xd0 + (long)p_Var7)) {
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).cstep;
    sVar5 = (this->weight_data_tm).elemsize;
    uVar17 = 0;
    do {
      if (iVar20 <= _h) {
        puVar13 = (undefined4 *)(((uVar17 & 0xffffffff) / uVar8) * sVar4 * sVar5 + (long)pvVar3);
        puVar18 = (undefined4 *)(local_c0.cstep * local_c0.elemsize * uVar17 + (long)local_c0.data);
        lVar12 = 0;
        do {
          if (0 < _w) {
            uVar11 = 0;
            puVar10 = puVar18;
            do {
              uVar22 = 0;
              puVar16 = puVar10;
              uVar14 = uVar8;
              puVar15 = puVar10;
              do {
                do {
                  *puVar13 = *puVar16;
                  puVar13 = puVar13 + 1;
                  uVar14 = uVar14 - 1;
                  puVar16 = (undefined4 *)((long)puVar16 + local_c0.cstep * local_c0.elemsize);
                } while (uVar14 != 0);
                uVar22 = uVar22 + 1;
                puVar16 = (undefined4 *)((long)puVar15 + (long)local_c0.w * local_c0.elemsize);
                uVar14 = uVar8;
                puVar15 = puVar16;
              } while (uVar22 != uVar21);
              uVar11 = uVar11 + 1;
              puVar10 = puVar10 + 1;
            } while (uVar11 != (uVar9 & 0xffffffff));
          }
          lVar12 = lVar12 + uVar21;
          puVar18 = (undefined4 *)((long)puVar18 + (long)local_c0.w * local_c0.elemsize * uVar21);
        } while (lVar12 < (long)((long)_h - (ulong)(iVar20 - 1)));
        p_Var7 = pp_Var2[-3];
      }
      uVar17 = uVar17 + uVar8;
    } while ((long)(uVar17 + (iVar19 - 1)) < (long)*(int *)(&this->field_0xd0 + (long)p_Var7));
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        if (local_c0.data != (void *)0x0) {
          free(local_c0.data);
        }
      }
      else {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var7 = this->_vptr_Deconvolution_x86_avx512[-3];
    piVar6 = *(int **)(&this->field_0x168 + (long)p_Var7);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var7) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var7) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var7));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var7) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var7) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var7) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var7) = 0;
  }
  piVar6 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if ((Allocator *)local_78._0_8_ != (Allocator *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx512::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}